

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

void __thiscall
gl3cts::PerVertexValidationTest::PerVertexValidationTest
          (PerVertexValidationTest *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"CommonBug_PerVertexValidation",
             "Conformance test which verifies that various requirements regarding gl_PerVertex block re-declarations, as described by the spec, are followed by the implementation"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dd4b48;
  this->m_fs_id = 0;
  this->m_fs_po_id = 0;
  this->m_gs_id = 0;
  this->m_gs_po_id = 0;
  this->m_pipeline_id = 0;
  this->m_tc_id = 0;
  this->m_tc_po_id = 0;
  this->m_te_id = 0;
  this->m_te_id = 0;
  this->m_te_po_id = 0;
  this->m_vs_id = 0;
  this->m_vs_po_id = 0;
  return;
}

Assistant:

PerVertexValidationTest::PerVertexValidationTest(deqp::Context& context)
	: TestCase(context, "CommonBug_PerVertexValidation",
			   "Conformance test which verifies that various requirements regarding gl_PerVertex block re-declarations,"
			   " as described by the spec, are followed by the implementation")
	, m_fs_id(0)
	, m_fs_po_id(0)
	, m_gs_id(0)
	, m_gs_po_id(0)
	, m_pipeline_id(0)
	, m_tc_id(0)
	, m_tc_po_id(0)
	, m_te_id(0)
	, m_te_po_id(0)
	, m_vs_id(0)
	, m_vs_po_id(0)
{
	/* Left blank on purpose */
}